

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arenastring.cc
# Opt level: O0

TaggedStringPtr __thiscall
google::protobuf::internal::anon_unknown_8::CreateString(anon_unknown_8 *this,string_view value)

{
  string *p;
  const_pointer pvVar1;
  size_type sVar2;
  allocator local_21;
  undefined1 local_20 [8];
  string_view value_local;
  TaggedStringPtr res;
  
  value_local._M_len = value._M_len;
  local_20 = (undefined1  [8])this;
  p = (string *)operator_new(0x20);
  pvVar1 = std::basic_string_view<char,_std::char_traits<char>_>::data
                     ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  sVar2 = std::basic_string_view<char,_std::char_traits<char>_>::length
                    ((basic_string_view<char,_std::char_traits<char>_> *)local_20);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)p,pvVar1,sVar2,&local_21);
  TaggedStringPtr::SetAllocated((TaggedStringPtr *)&value_local._M_str,p);
  std::allocator<char>::~allocator((allocator<char> *)&local_21);
  return (TaggedStringPtr)value_local._M_str;
}

Assistant:

inline TaggedStringPtr CreateString(absl::string_view value) {
  TaggedStringPtr res;
  res.SetAllocated(new std::string(value.data(), value.length()));
  return res;
}